

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O0

CURLMcode Curl_multi_ev_assess_xfer_bset(Curl_multi *multi,uint_bset *set)

{
  _Bool _Var1;
  Curl_easy *data_00;
  _Bool local_29;
  Curl_easy *data;
  CURLMcode result;
  uint mid;
  uint_bset *set_local;
  Curl_multi *multi_local;
  
  data._0_4_ = CURLM_OK;
  if (((multi != (Curl_multi *)0x0) && (multi->socket_cb != (curl_socket_callback)0x0)) &&
     (_result = set, set_local = (uint_bset *)multi,
     _Var1 = Curl_uint_bset_first(set,(uint *)((long)&data + 4)), _Var1)) {
    do {
      data_00 = Curl_multi_get_easy((Curl_multi *)set_local,data._4_4_);
      if (data_00 != (Curl_easy *)0x0) {
        data._0_4_ = Curl_multi_ev_assess_xfer((Curl_multi *)set_local,data_00);
      }
      local_29 = false;
      if ((CURLMcode)data == CURLM_OK) {
        local_29 = Curl_uint_bset_next(_result,data._4_4_,(uint *)((long)&data + 4));
      }
    } while (local_29 != false);
  }
  return (CURLMcode)data;
}

Assistant:

CURLMcode Curl_multi_ev_assess_xfer_bset(struct Curl_multi *multi,
                                         struct uint_bset *set)
{
  unsigned int mid;
  CURLMcode result = CURLM_OK;

  if(multi && multi->socket_cb && Curl_uint_bset_first(set, &mid)) {
    do {
      struct Curl_easy *data = Curl_multi_get_easy(multi, mid);
      if(data)
        result = Curl_multi_ev_assess_xfer(multi, data);
    }
    while(!result && Curl_uint_bset_next(set, mid, &mid));
  }
  return result;
}